

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

void lexer_DumpStringExpansions(void)

{
  Expansion *local_10;
  Expansion *exp;
  
  if (lexerState != (LexerState *)0x0) {
    for (local_10 = lexerState->expansions; local_10 != (Expansion *)0x0;
        local_10 = local_10->parent) {
      if (local_10->name != (char *)0x0) {
        fprintf(_stderr,"while expanding symbol \"%s\"\n",local_10->name);
      }
    }
  }
  return;
}

Assistant:

void lexer_DumpStringExpansions(void)
{
	if (!lexerState)
		return;

	for (struct Expansion *exp = lexerState->expansions; exp; exp = exp->parent) {
		// Only register EQUS expansions, not string args
		if (exp->name)
			fprintf(stderr, "while expanding symbol \"%s\"\n", exp->name);
	}
}